

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Texture_Create
          (CCommandProcessorFragment_OpenGL *this,CTextureCreateCommand *pCommand)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  float fVar6;
  int i_2;
  int y;
  char *pTileData;
  int py;
  int px;
  int i_1;
  int ImagePitch;
  int TileRowSize;
  int TileSize;
  char *pTmpData_2;
  int MemSize;
  int Depth;
  int TexHeight;
  int TexWidth;
  bool Mipmaps;
  int StoreOglformat;
  int Oglformat;
  float a;
  int i;
  uchar *pTexels;
  void *pTmpData_1;
  void *pTmpData;
  int MaxTexSize;
  void *pTexData;
  int Height;
  int Width;
  int in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  void *in_stack_ffffffffffffff38;
  undefined4 uVar7;
  bool local_a1;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar8;
  undefined8 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int iVar9;
  int in_stack_ffffffffffffff84;
  int local_5c;
  int local_58;
  int local_50;
  int local_44;
  int local_24;
  void *local_20;
  int local_18;
  int local_14;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_14 = *(int *)(in_RSI + 0x14);
  local_18 = *(int *)(in_RSI + 0x18);
  local_20 = *(void **)(in_RSI + 0x30);
  if ((*(int *)(in_RSI + 0x20) == 2) || (*(int *)(in_RSI + 0x20) == 1)) {
    local_24 = *(int *)(in_RDI + 0x20008);
    if (((*(uint *)(in_RSI + 0x28) & 8) != 0) && (0x3f < *(int *)(in_RDI + 0x2000c))) {
      if ((*(uint *)(in_RSI + 0x28) & 0x10) == 0) {
        local_24 = *(int *)(in_RDI + 0x2000c) << 4;
      }
      else {
        local_24 = minimum<int>(local_24,*(int *)(in_RDI + 0x2000c) << 4);
      }
    }
    if ((local_24 < local_14) || (local_24 < local_18)) {
      do {
        local_14 = local_14 >> 1;
        local_18 = local_18 >> 1;
        local_a1 = local_24 < local_14 || local_24 < local_18;
      } while (local_a1);
      local_20 = Rescale(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,iVar1,
                         (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      mem_free((void *)0x11bfbf);
    }
    else if (((0x10 < local_14) && (0x10 < local_18)) && ((*(uint *)(in_RSI + 0x28) & 4) == 0)) {
      local_14 = local_14 >> 1;
      local_18 = local_18 >> 1;
      local_20 = Rescale(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,iVar1,
                         (uchar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      mem_free((void *)0x11c07d);
    }
  }
  if (*(int *)(in_RSI + 0x20) == 2) {
    for (local_44 = 0; local_44 < local_14 * local_18; local_44 = local_44 + 1) {
      fVar6 = (float)*(byte *)((long)local_20 + (long)(local_44 << 2) + 3) / 255.0;
      *(char *)((long)local_20 + (long)(local_44 << 2)) =
           (char)(int)((float)*(byte *)((long)local_20 + (long)(local_44 << 2)) * fVar6);
      *(char *)((long)local_20 + (long)(local_44 << 2) + 1) =
           (char)(int)((float)*(byte *)((long)local_20 + (long)(local_44 << 2) + 1) * fVar6);
      *(char *)((long)local_20 + (long)(local_44 * 4 + 2)) =
           (char)(int)((float)*(byte *)((long)local_20 + (long)(local_44 << 2) + 2) * fVar6);
    }
  }
  *(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20 + 0x18) =
       *(undefined4 *)(in_RSI + 0x20);
  iVar1 = TexFormatToOpenGLFormat(*(int *)(in_RSI + 0x20));
  local_50 = TexFormatToOpenGLFormat(*(int *)(in_RSI + 0x24));
  if ((*(uint *)(in_RSI + 0x28) & 2) != 0) {
    if (local_50 == 0x1906) {
      local_50 = 0x84e9;
    }
    else if (local_50 == 0x1907) {
      local_50 = 0x84ed;
    }
    else if (local_50 == 0x1908) {
      local_50 = 0x84ee;
    }
    else {
      local_50 = 0x84ee;
    }
  }
  if ((*(uint *)(in_RSI + 0x28) & 0x10) != 0) {
    bVar5 = (*(uint *)(in_RSI + 0x28) & 1) == 0;
    glGenTextures(1,in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20);
    lVar4 = in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20;
    *(uint *)(lVar4 + 0x14) = *(uint *)(lVar4 + 0x14) | 1;
    glBindTexture(0xde1,*(undefined4 *)(in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20));
    in_stack_ffffffffffffff28 = iVar1;
    if (bVar5) {
      glTexParameteri(0xde1,0x2800,0x2601);
      if ((*(uint *)(in_RSI + 0x28) & 0x20) == 0) {
        glTexParameteri(0xde1,0x2801,0x2701);
      }
      else {
        glTexParameteri(0xde1,0x2801,0x2601);
      }
      glTexParameteri(0xde1,0x8191,1);
      in_stack_ffffffffffffff30 = 0x1401;
      glTexImage2D(0xde1,0,local_50,local_14,local_18);
    }
    else {
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      in_stack_ffffffffffffff30 = 0x1401;
      glTexImage2D(0xde1,0,local_50,local_14,local_18);
    }
    *(int *)(in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20 + 0x1c) =
         local_14 * local_18 * *(int *)(in_RSI + 0x1c);
    in_stack_ffffffffffffff38 = local_20;
    if (bVar5) {
      local_58 = local_14;
      local_5c = local_18;
      while (2 < local_58 && 2 < local_5c) {
        local_58 = local_58 >> 1;
        local_5c = local_5c >> 1;
        lVar4 = in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20;
        *(int *)(lVar4 + 0x1c) =
             local_58 * local_5c * *(int *)(in_RSI + 0x1c) + *(int *)(lVar4 + 0x1c);
      }
    }
  }
  if (((*(uint *)(in_RSI + 0x28) & 8) != 0) && (0x3f < *(int *)(in_RDI + 0x2000c))) {
    local_14 = local_14 / 0x10;
    local_18 = local_18 / 0x10;
    iVar2 = minimum<int>(*(int *)(in_RDI + 0x2000c),0x100);
    pvVar3 = mem_alloc(0);
    mem_zero((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
    for (iVar9 = 0; iVar9 < 0x100; iVar9 = iVar9 + 1) {
      for (iVar8 = 0; iVar8 < local_18; iVar8 = iVar8 + 1) {
        mem_copy((void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0);
      }
    }
    mem_free((void *)0x11c735);
    glGenTextures(*(undefined4 *)(in_RDI + 0x20010),
                  in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20 + 4);
    lVar4 = in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20;
    *(uint *)(lVar4 + 0x14) = *(uint *)(lVar4 + 0x14) | 2;
    for (iVar9 = 0; uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
        iVar9 < *(int *)(in_RDI + 0x20010); iVar9 = iVar9 + 1) {
      glBindTexture(0x806f,*(undefined4 *)
                            (in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20 + 4 + (long)iVar9 * 4));
      glTexParameteri(0x806f,0x2800,0x2601);
      glTexParameteri(0x806f,0x2801,0x2601);
      in_stack_ffffffffffffff38 = (void *)CONCAT44(uVar7,0x1401);
      glTexImage3D(0x806f,0,local_50,local_14,local_18,iVar2,0,iVar1,in_stack_ffffffffffffff38,
                   (long)pvVar3 +
                   (long)(iVar9 * local_14 * local_18 * iVar2 * *(int *)(in_RSI + 0x1c)));
      lVar4 = in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20;
      *(int *)(lVar4 + 0x1c) =
           local_14 * local_18 * *(int *)(in_RSI + 0x1c) + *(int *)(lVar4 + 0x1c);
    }
  }
  **(int **)(in_RDI + 0x20000) =
       **(int **)(in_RDI + 0x20000) + *(int *)(in_RDI + (long)*(int *)(in_RSI + 0x10) * 0x20 + 0x1c)
  ;
  mem_free((void *)0x11c905);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Texture_Create(const CCommandBuffer::CTextureCreateCommand *pCommand)
{
	int Width = pCommand->m_Width;
	int Height = pCommand->m_Height;
	void *pTexData = pCommand->m_pData;

	// resample if needed
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA || pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGB)
	{
		int MaxTexSize = m_MaxTexSize;
		if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
		{
			if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
				MaxTexSize = minimum(MaxTexSize, m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION);
			else
				MaxTexSize = m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION;
		}
		if(Width > MaxTexSize || Height > MaxTexSize)
		{
			do
			{
				Width>>=1;
				Height>>=1;
			}
			while(Width > MaxTexSize || Height > MaxTexSize);

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
		else if(Width > IGraphics::NUMTILES_DIMENSION && Height > IGraphics::NUMTILES_DIMENSION && (pCommand->m_Flags&CCommandBuffer::TEXFLAG_QUALITY) == 0)
		{
			Width>>=1;
			Height>>=1;

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
	}

	// use premultiplied alpha for rgba textures
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA)
	{
		unsigned char *pTexels = (unsigned char *)pTexData;
		for(int i = 0; i < Width * Height; ++i)
		{
			const float a = (pTexels[i*4+3]/255.0f);
			pTexels[i*4+0] = (unsigned char)(pTexels[i*4+0] * a);
			pTexels[i*4+1] = (unsigned char)(pTexels[i*4+1] * a);
			pTexels[i*4+2] = (unsigned char)(pTexels[i*4+2] * a);
		}
	}
	m_aTextures[pCommand->m_Slot].m_Format = pCommand->m_Format;

	//
	int Oglformat = TexFormatToOpenGLFormat(pCommand->m_Format);
	int StoreOglformat = TexFormatToOpenGLFormat(pCommand->m_StoreFormat);

	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_COMPRESSED)
	{
		switch(StoreOglformat)
		{
			case GL_RGB: StoreOglformat = GL_COMPRESSED_RGB_ARB; break;
			case GL_ALPHA: StoreOglformat = GL_COMPRESSED_ALPHA_ARB; break;
			case GL_RGBA: StoreOglformat = GL_COMPRESSED_RGBA_ARB; break;
			default: StoreOglformat = GL_COMPRESSED_RGBA_ARB;
		}
	}

	// 2D texture
	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
	{
		bool Mipmaps = !(pCommand->m_Flags&CCommandBuffer::TEXFLAG_NOMIPMAPS);
		glGenTextures(1, &m_aTextures[pCommand->m_Slot].m_Tex2D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX2D;
		glBindTexture(GL_TEXTURE_2D, m_aTextures[pCommand->m_Slot].m_Tex2D);
		if(!Mipmaps)
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}
		else
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			if(pCommand->m_Flags&CCommandBuffer::TEXTFLAG_LINEARMIPMAPS)
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			else
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_GENERATE_MIPMAP, GL_TRUE);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}

		// calculate memory usage
		m_aTextures[pCommand->m_Slot].m_MemSize = Width*Height*pCommand->m_PixelSize;
		if(Mipmaps)
		{
			int TexWidth = Width;
			int TexHeight = Height;
			while(TexWidth > 2 && TexHeight > 2)
			{
				TexWidth>>=1;
				TexHeight>>=1;
				m_aTextures[pCommand->m_Slot].m_MemSize += TexWidth*TexHeight*pCommand->m_PixelSize;
			}
		}
	}

	// 3D texture
	if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
	{
		Width /= IGraphics::NUMTILES_DIMENSION;
		Height /= IGraphics::NUMTILES_DIMENSION;
		int Depth = minimum(m_Max3DTexSize, IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION);

		// copy and reorder texture data
		int MemSize = Width*Height*IGraphics::NUMTILES_DIMENSION*IGraphics::NUMTILES_DIMENSION*pCommand->m_PixelSize;
		char *pTmpData = (char *)mem_alloc(MemSize);

		const int TileSize = (Height * Width) * pCommand->m_PixelSize;
		const int TileRowSize = Width * pCommand->m_PixelSize;
		const int ImagePitch = Width * IGraphics::NUMTILES_DIMENSION * pCommand->m_PixelSize;
		mem_zero(pTmpData, MemSize);
		for(int i = 0; i < IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION; i++)
		{
			const int px = (i%IGraphics::NUMTILES_DIMENSION) * Width;
			const int py = (i/IGraphics::NUMTILES_DIMENSION) * Height;
			const char *pTileData = (const char *)pTexData + (py * Width * IGraphics::NUMTILES_DIMENSION + px) * pCommand->m_PixelSize;
			for(int y = 0; y < Height; y++)
				mem_copy(pTmpData + i*TileSize + y*TileRowSize, pTileData + y * ImagePitch, TileRowSize);
		}

		mem_free(pTexData);

		//
		glGenTextures(m_TextureArraySize, m_aTextures[pCommand->m_Slot].m_Tex3D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX3D;
		for(int i = 0; i < m_TextureArraySize; ++i)
		{
			glBindTexture(GL_TEXTURE_3D, m_aTextures[pCommand->m_Slot].m_Tex3D[i]);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			pTexData = pTmpData+i*(Width*Height*Depth*pCommand->m_PixelSize);
			glTexImage3D(GL_TEXTURE_3D, 0, StoreOglformat, Width, Height, Depth, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);

			m_aTextures[pCommand->m_Slot].m_MemSize += Width*Height*pCommand->m_PixelSize;
		}
		pTexData = pTmpData;
	}

	*m_pTextureMemoryUsage += m_aTextures[pCommand->m_Slot].m_MemSize;

	mem_free(pTexData);
}